

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O1

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::regenerateMipMapLevels
          (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this,void *data,u32 layer)

{
  long lVar1;
  ITexture *texture;
  u32 uVar2;
  u32 level;
  uint uVar3;
  uint uVar4;
  
  if ((((this->super_ITexture).HasMipMaps == true) && (this->LegacyAutoGenerateMipMaps == false)) &&
     ((1 < (this->super_ITexture).Size.Width || (1 < (this->super_ITexture).Size.Height)))) {
    lVar1 = *(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0x528);
    texture = *(ITexture **)(lVar1 + 0x20);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::set((STextureCache *)(lVar1 + 0x10),0,&this->super_ITexture,EST_ACTIVE_ALWAYS);
    if (data == (void *)0x0) {
      (*GL.GenerateMipmap)(*(GLenum *)&(this->super_ITexture).field_0x80);
    }
    else {
      uVar3 = (this->super_ITexture).Size.Width;
      uVar4 = (this->super_ITexture).Size.Height;
      level = 1;
      do {
        uVar3 = uVar3 >> (1 < uVar3);
        uVar4 = uVar4 >> (1 < uVar4);
        uVar2 = IImage::getBitsPerPixelFromFormat((this->super_ITexture).ColorFormat);
        uploadTexture(this,true,layer,level,data);
        data = (void *)((long)data + (ulong)(uVar4 * uVar3 * (uVar2 >> 3)));
        level = level + 1;
      } while (uVar4 != 1 || uVar3 != 1);
    }
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::set
              ((STextureCache *)
               (*(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0x528) + 0x10),0,texture,
               EST_ACTIVE_ALWAYS);
    return;
  }
  return;
}

Assistant:

void regenerateMipMapLevels(void *data = 0, u32 layer = 0) override
	{
		if (!HasMipMaps || LegacyAutoGenerateMipMaps || (Size.Width <= 1 && Size.Height <= 1))
			return;

		const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
		Driver->getCacheHandler()->getTextureCache().set(0, this);

		if (data) {
			u32 width = Size.Width;
			u32 height = Size.Height;
			u8 *tmpData = static_cast<u8 *>(data);
			u32 dataSize = 0;
			u32 level = 0;

			do {
				if (width > 1)
					width >>= 1;

				if (height > 1)
					height >>= 1;

				dataSize = IImage::getDataSizeFromFormat(ColorFormat, width, height);
				++level;

				uploadTexture(true, layer, level, tmpData);

				tmpData += dataSize;
			} while (width != 1 || height != 1);
		} else {
			Driver->irrGlGenerateMipmap(TextureType);
		}

		Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);
	}